

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerCheckWasmSignature(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  uint index;
  uint32 uVar4;
  JITTimeFunctionBody *pJVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  IntConstOpnd *pIVar8;
  RegOpnd *pRVar9;
  IndirOpnd *pIVar10;
  AsmJsJITInfo *pAVar11;
  WasmSignature *this_00;
  size_t sVar12;
  intptr_t address;
  AddrOpnd *opndArg;
  LabelInstr *target;
  LabelInstr *target_00;
  IndirOpnd *shortSigIndir;
  RegOpnd *actualRegOpnd;
  LabelInstr *labelFallThrough;
  LabelInstr *trapLabel;
  AddrOpnd *expectedOpnd;
  intptr_t sigAddr;
  WasmSignature *expectedSig;
  IndirOpnd *actualSig;
  Instr *instrPrev;
  int sigId;
  Instr *instr_local;
  Lowerer *this_local;
  
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar5);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2165,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar7 = IR::Instr::GetSrc1(instr);
  if (pOVar7 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2166,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar7 = IR::Instr::GetSrc2(instr);
  bVar3 = IR::Opnd::IsIntConstOpnd(pOVar7);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2167,"(instr->GetSrc2()->IsIntConstOpnd())",
                       "instr->GetSrc2()->IsIntConstOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar7 = IR::Instr::UnlinkSrc2(instr);
  pIVar8 = IR::Opnd::AsIntConstOpnd(pOVar7);
  index = IR::IntConstOpnd::AsInt32(pIVar8);
  pIVar1 = instr->m_prev;
  pOVar7 = IR::Instr::UnlinkSrc1(instr);
  pRVar9 = IR::Opnd::AsRegOpnd(pOVar7);
  uVar4 = Js::WasmScriptFunction::GetOffsetOfSignature();
  pIVar10 = IR::IndirOpnd::New(pRVar9,uVar4,TyInt64,this->m_func,false);
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  pAVar11 = JITTimeFunctionBody::GetAsmJsInfo(pJVar5);
  this_00 = AsmJsJITInfo::GetWasmSignature(pAVar11,index);
  sVar12 = Wasm::WasmSignature::GetShortSig(this_00);
  if (sVar12 == 0xffffffffffffffff) {
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    pAVar11 = JITTimeFunctionBody::GetAsmJsInfo(pJVar5);
    address = AsmJsJITInfo::GetWasmSignatureAddr(pAVar11,index);
    opndArg = IR::AddrOpnd::New(address,AddrOpndKindConstantAddress,this->m_func,false,(Var)0x0);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pIVar10->super_Opnd);
    LoadScriptContext(this,instr);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr,HelperOp_CheckWasmSignature,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
  }
  else {
    target = InsertLabel(true,instr);
    target_00 = InsertLabel(false,instr->m_next);
    pRVar9 = IR::RegOpnd::New(TyInt64,this->m_func);
    InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,&target->super_Instr,true);
    uVar4 = Wasm::WasmSignature::GetOffsetOfShortSig();
    pIVar10 = IR::IndirOpnd::New(pRVar9,uVar4,TyInt64,this->m_func,false);
    sVar12 = Wasm::WasmSignature::GetShortSig(this_00);
    pIVar8 = IR::IntConstOpnd::New(sVar12,TyInt64,this->m_func,false);
    InsertCompareBranch(this,&pIVar10->super_Opnd,&pIVar8->super_Opnd,BrNeq_A,target,
                        &target->super_Instr,false);
    InsertBranch(Br,target_00,&target->super_Instr);
    pOVar7 = IR::IntConstOpnd::NewFromType(0x1b66,TyInt32,this->m_func);
    GenerateThrow(this,pOVar7,instr);
    IR::Instr::Remove(instr);
  }
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerCheckWasmSignature(IR::Instr * instr)
{
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc2()->IsIntConstOpnd());

    int sigId = instr->UnlinkSrc2()->AsIntConstOpnd()->AsInt32();

    IR::Instr *instrPrev = instr->m_prev;

    IR::IndirOpnd * actualSig = IR::IndirOpnd::New(instr->UnlinkSrc1()->AsRegOpnd(), Js::WasmScriptFunction::GetOffsetOfSignature(), TyMachReg, m_func);

    Wasm::WasmSignature * expectedSig = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetWasmSignature(sigId);
    if (expectedSig->GetShortSig() == Js::Constants::InvalidSignature)
    {
        intptr_t sigAddr = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetWasmSignatureAddr(sigId);
        IR::AddrOpnd * expectedOpnd = IR::AddrOpnd::New(sigAddr, IR::AddrOpndKindConstantAddress, m_func);
        m_lowererMD.LoadHelperArgument(instr, expectedOpnd);
        m_lowererMD.LoadHelperArgument(instr, actualSig);

        LoadScriptContext(instr);

        m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_CheckWasmSignature);
    }
    else
    {
        IR::LabelInstr * trapLabel = InsertLabel(true, instr);
        IR::LabelInstr * labelFallThrough = InsertLabel(false, instr->m_next);
        IR::RegOpnd * actualRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);
        InsertMove(actualRegOpnd, actualSig, trapLabel);

        IR::IndirOpnd * shortSigIndir = IR::IndirOpnd::New(actualRegOpnd, Wasm::WasmSignature::GetOffsetOfShortSig(), TyMachReg, m_func);
        InsertCompareBranch(shortSigIndir, IR::IntConstOpnd::New(expectedSig->GetShortSig(), TyMachReg, m_func), Js::OpCode::BrNeq_A, trapLabel, trapLabel);

        InsertBranch(Js::OpCode::Br, labelFallThrough, trapLabel);

        GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_SignatureMismatch), TyInt32, m_func), instr);

        instr->Remove();

    }


    return instrPrev;
}